

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateVkImpl::ShaderStageInfo::Append(ShaderStageInfo *this,ShaderVkImpl *pShader)

{
  SHADER_TYPE ShaderType;
  bool bVar1;
  Char *pCVar2;
  iterator __first;
  iterator __last;
  ShaderDesc *pSVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  char (*in_RCX) [19];
  char (*Args_1) [34];
  char (*in_R8) [61];
  char (*in_stack_fffffffffffffee8) [3];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  Char *local_e0;
  Char *local_d8;
  undefined1 local_d0 [8];
  string msg_3;
  string msg_2;
  undefined1 local_88 [4];
  SHADER_TYPE NewShaderType;
  string msg_1;
  __normal_iterator<const_Diligent::ShaderVkImpl_**,_std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>_>
  local_50 [3];
  undefined1 local_38 [8];
  string msg;
  ShaderVkImpl *pShader_local;
  ShaderStageInfo *this_local;
  
  msg.field_2._8_8_ = pShader;
  if (pShader == (ShaderVkImpl *)0x0) {
    FormatString<char[26],char[19]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pShader != nullptr",in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"Append",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x235);
    std::__cxx11::string::~string((string *)local_38);
  }
  __first = std::
            vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
            ::begin(&this->Shaders);
  __last = std::
           vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>::
           end(&this->Shaders);
  local_50[0] = std::
                find<__gnu_cxx::__normal_iterator<Diligent::ShaderVkImpl_const**,std::vector<Diligent::ShaderVkImpl_const*,std::allocator<Diligent::ShaderVkImpl_const*>>>,Diligent::ShaderVkImpl_const*>
                          (__first._M_current,__last._M_current,
                           (ShaderVkImpl **)((long)&msg.field_2 + 8));
  msg_1.field_2._8_8_ =
       std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
       ::end(&this->Shaders);
  bVar1 = __gnu_cxx::operator==
                    (local_50,(__normal_iterator<const_Diligent::ShaderVkImpl_**,_std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>_>
                               *)((long)&msg_1.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pSVar3 = DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                        *)msg.field_2._8_8_);
    FormatString<char[9],char_const*,char[61]>
              ((string *)local_88,(Diligent *)"Shader \'",(char (*) [9])pSVar3,
               (char **)"\' already exists in the stage. Shaders must be deduplicated.",in_R8);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"Append",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x237);
    std::__cxx11::string::~string((string *)local_88);
  }
  pSVar3 = DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
           ::GetDesc((DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                      *)msg.field_2._8_8_);
  ShaderType = pSVar3->ShaderType;
  Args_1 = (char (*) [34])(ulong)ShaderType;
  if (this->Type == SHADER_TYPE_UNKNOWN) {
    bVar1 = std::
            vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
            ::empty(&this->Shaders);
    if ((!bVar1) ||
       (bVar1 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::empty(&this->SPIRVs), !bVar1)) {
      FormatString<char[26],char[34]>
                ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Shaders.empty() && SPIRVs.empty()",Args_1);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"Append",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                 ,0x23c);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
    this->Type = ShaderType;
  }
  else if (this->Type != ShaderType) {
    local_d8 = GetShaderTypeLiteralName(ShaderType);
    pSVar3 = DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                        *)msg.field_2._8_8_);
    local_e0 = GetShaderTypeLiteralName(this->Type);
    FormatString<char[11],char_const*,char[14],char_const*,char[65],char_const*,char[3]>
              ((string *)local_d0,(Diligent *)"The type (",(char (*) [11])&local_d8,
               (char **)") of shader \'",(char (*) [14])pSVar3,
               (char **)"\' being added to the stage is inconsistent with the stage type (",
               (char (*) [65])&local_e0,(char **)0xccce78,in_stack_fffffffffffffee8);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"Append",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x243);
    std::__cxx11::string::~string((string *)local_d0);
  }
  std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>::
  push_back(&this->Shaders,(value_type *)((long)&msg.field_2 + 8));
  this_00 = &this->SPIRVs;
  __x = ShaderVkImpl::GetSPIRV((ShaderVkImpl *)msg.field_2._8_8_);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back(this_00,__x);
  return;
}

Assistant:

void PipelineStateVkImpl::ShaderStageInfo::Append(const ShaderVkImpl* pShader)
{
    VERIFY_EXPR(pShader != nullptr);
    VERIFY(std::find(Shaders.begin(), Shaders.end(), pShader) == Shaders.end(),
           "Shader '", pShader->GetDesc().Name, "' already exists in the stage. Shaders must be deduplicated.");

    const SHADER_TYPE NewShaderType = pShader->GetDesc().ShaderType;
    if (Type == SHADER_TYPE_UNKNOWN)
    {
        VERIFY_EXPR(Shaders.empty() && SPIRVs.empty());
        Type = NewShaderType;
    }
    else
    {
        VERIFY(Type == NewShaderType, "The type (", GetShaderTypeLiteralName(NewShaderType),
               ") of shader '", pShader->GetDesc().Name, "' being added to the stage is inconsistent with the stage type (",
               GetShaderTypeLiteralName(Type), ").");
    }
    Shaders.push_back(pShader);
    SPIRVs.push_back(pShader->GetSPIRV());
}